

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaMultiGenerator::CloseBuildFileStreams(cmGlobalNinjaMultiGenerator *this)

{
  cmGeneratedFileStream *pcVar1;
  mapped_type *pmVar2;
  pointer __k;
  cmAlphaNum local_c8;
  cmAlphaNum local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  pcVar1 = (this->CommonFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  if (pcVar1 == (cmGeneratedFileStream *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Common file stream was not open.",(allocator<char> *)&local_98);
    cmSystemTools::Error((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  else {
    (this->CommonFileStream)._M_t.
    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
    super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
         (cmGeneratedFileStream *)0x0;
    (**(code **)(*(long *)&(pcVar1->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_> + 8))();
  }
  pcVar1 = (this->DefaultFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  if (pcVar1 != (cmGeneratedFileStream *)0x0) {
    (this->DefaultFileStream)._M_t.
    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
    super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
         (cmGeneratedFileStream *)0x0;
    (**(code **)(*(long *)&(pcVar1->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_> + 8))();
  }
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            (&local_68,
             (cmMakefile *)
             (((this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.
               super_cmGlobalGenerator.Makefiles.
               super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
             IncludeEmptyConfig);
  for (__k = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __k != local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>_>_>_>
             ::operator[](&this->ImplFileStreams,__k);
    if ((pmVar2->_M_t).
        super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>.
        _M_t.
        super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
        .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl ==
        (cmGeneratedFileStream *)0x0) {
      local_c8.View_._M_len = 0x16;
      local_c8.View_._M_str = "Impl file stream for \"";
      local_98.View_._M_str = (__k->_M_dataplus)._M_p;
      local_98.View_._M_len = __k->_M_string_length;
      cmStrCat<char[16]>(&local_50,&local_c8,&local_98,(char (*) [16])"\" was not open.");
      cmSystemTools::Error(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>_>_>_>
               ::operator[](&this->ImplFileStreams,__k);
      pcVar1 = (pmVar2->_M_t).
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
      (pmVar2->_M_t).
      super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t
      .super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
      super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
           (cmGeneratedFileStream *)0x0;
      if (pcVar1 != (cmGeneratedFileStream *)0x0) {
        (**(code **)(*(long *)&(pcVar1->super_ofstream).
                               super_basic_ostream<char,_std::char_traits<char>_> + 8))();
      }
    }
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>_>_>_>
             ::operator[](&this->ConfigFileStreams,__k);
    if ((pmVar2->_M_t).
        super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>.
        _M_t.
        super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
        .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl ==
        (cmGeneratedFileStream *)0x0) {
      local_c8.View_._M_len = (size_t)&DAT_00000018;
      local_c8.View_._M_str = "Config file stream for \"";
      local_98.View_._M_str = (__k->_M_dataplus)._M_p;
      local_98.View_._M_len = __k->_M_string_length;
      cmStrCat<char[16]>(&local_50,&local_c8,&local_98,(char (*) [16])"\" was not open.");
      cmSystemTools::Error(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>_>_>_>
               ::operator[](&this->ConfigFileStreams,__k);
      pcVar1 = (pmVar2->_M_t).
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
      (pmVar2->_M_t).
      super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t
      .super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
      super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
           (cmGeneratedFileStream *)0x0;
      if (pcVar1 != (cmGeneratedFileStream *)0x0) {
        (**(code **)(*(long *)&(pcVar1->super_ofstream).
                               super_basic_ostream<char,_std::char_traits<char>_> + 8))();
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void cmGlobalNinjaMultiGenerator::CloseBuildFileStreams()
{
  if (this->CommonFileStream) {
    this->CommonFileStream.reset();
  } else {
    cmSystemTools::Error("Common file stream was not open.");
  }

  if (this->DefaultFileStream) {
    this->DefaultFileStream.reset();
  } // No error if it wasn't open

  for (auto const& config : this->Makefiles[0]->GetGeneratorConfigs(
         cmMakefile::IncludeEmptyConfig)) {
    if (this->ImplFileStreams[config]) {
      this->ImplFileStreams[config].reset();
    } else {
      cmSystemTools::Error(
        cmStrCat("Impl file stream for \"", config, "\" was not open."));
    }
    if (this->ConfigFileStreams[config]) {
      this->ConfigFileStreams[config].reset();
    } else {
      cmSystemTools::Error(
        cmStrCat("Config file stream for \"", config, "\" was not open."));
    }
  }
}